

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::remove_time_critical_piece
          (torrent *this,piece_index_t piece,bool finished)

{
  int *piVar1;
  pointer *pptVar2;
  byte bVar3;
  piece_index_t piece_00;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  undefined1 auVar4 [16];
  pointer __dest;
  int iVar5;
  time_point tVar6;
  undefined4 extraout_var;
  int iVar7;
  int iVar8;
  int iVar9;
  pointer __src;
  pointer ptVar10;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_44;
  undefined1 local_40 [20];
  undefined1 local_2c;
  generic_error_category *local_28;
  
  ptVar10 = (this->m_time_critical_pieces).
            super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __dest = ptVar10;
  while( true ) {
    if (ptVar10 ==
        (this->m_time_critical_pieces).
        super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    __src = __dest + 1;
    piece_00.m_val = (ptVar10->piece).m_val;
    if (piece_00.m_val == piece.m_val) break;
    ptVar10 = ptVar10 + 1;
    __dest = __src;
  }
  bVar3 = (ptVar10->flags).m_val;
  local_44.m_val = piece.m_val;
  if (finished) {
    if ((bVar3 & 1) != 0) {
      read_piece(this,piece_00);
    }
    tVar6 = time_now();
    auVar4 = SEXT816((long)tVar6.__d.__r - (ptVar10->first_requested).__d.__r) *
             SEXT816(0x431bde82d7b634db);
    iVar8 = (int)(auVar4._8_8_ >> 0x12) - (auVar4._12_4_ >> 0x1f);
    iVar5 = this->m_average_piece_time;
    if (iVar5 != 0) {
      iVar9 = iVar8 - iVar5;
      iVar7 = -iVar9;
      if (0 < iVar9) {
        iVar7 = iVar9;
      }
      if (this->m_piece_time_deviation != 0) {
        iVar7 = (this->m_piece_time_deviation * 9 + iVar7) / 10;
      }
      this->m_piece_time_deviation = iVar7;
      iVar8 = (iVar5 * 9 + iVar8) / 10;
    }
    this->m_average_piece_time = iVar8;
  }
  else if ((bVar3 & 1) != 0) {
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)local_40);
    local_40._16_4_ = 0x7d;
    local_2c = 1;
    local_28 = &boost::system::detail::cat_holder<void>::generic_category_instance;
    alert_manager::
    emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::system::error_code>
              ((alert_manager *)CONCAT44(extraout_var,iVar5),(torrent_handle *)local_40,&local_44,
               (error_code *)(local_40 + 0x10));
    if ((_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)local_40._8_8_ !=
        (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_40._8_8_)->
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ).
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4);
        iVar5 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_40._8_8_)->
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ).
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4);
        *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_40._8_8_)->
                        super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        ).
                        super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*(code *)(((vector<piece_pos,_piece_index_t> *)local_40._8_8_)->
                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ).
                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ._M_impl.super__Vector_impl_data._M_start[3])();
      }
    }
  }
  this_00._M_head_impl =
       (this->super_torrent_hot_members).m_picker._M_t.
       super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
       ._M_t.
       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
  if (this_00._M_head_impl != (piece_picker *)0x0) {
    piece_picker::set_piece_priority
              (this_00._M_head_impl,(piece_index_t)local_44.m_val,(download_priority_t)0x1);
  }
  ptVar10 = (this->m_time_critical_pieces).
            super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (__src != ptVar10) {
    memmove(__dest,__src,(long)ptVar10 - (long)__src);
  }
  pptVar2 = &(this->m_time_critical_pieces).
             super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *pptVar2 = *pptVar2 + -1;
  return;
}

Assistant:

void torrent::remove_time_critical_piece(piece_index_t const piece, bool const finished)
	{
		for (auto i = m_time_critical_pieces.begin(), end(m_time_critical_pieces.end());
			i != end; ++i)
		{
			if (i->piece != piece) continue;
			if (finished)
			{
				if (i->flags & torrent_handle::alert_when_available)
				{
					read_piece(i->piece);
				}

				// if first_requested is min_time(), it wasn't requested as a critical piece
				// and we shouldn't adjust any average download times
				if (i->first_requested != min_time())
				{
					// update the average download time and average
					// download time deviation
					int const dl_time = aux::numeric_cast<int>(total_milliseconds(aux::time_now() - i->first_requested));

					if (m_average_piece_time == 0)
					{
						m_average_piece_time = dl_time;
					}
					else
					{
						int diff = std::abs(dl_time - m_average_piece_time);
						if (m_piece_time_deviation == 0) m_piece_time_deviation = diff;
						else m_piece_time_deviation = (m_piece_time_deviation * 9 + diff) / 10;

						m_average_piece_time = (m_average_piece_time * 9 + dl_time) / 10;
					}
				}
			}
			else if (i->flags & torrent_handle::alert_when_available)
			{
				// post an empty read_piece_alert to indicate it failed
				alerts().emplace_alert<read_piece_alert>(
					get_handle(), piece, error_code(boost::system::errc::operation_canceled, generic_category()));
			}
			if (has_picker()) m_picker->set_piece_priority(piece, low_priority);
			m_time_critical_pieces.erase(i);
			return;
		}
	}